

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMeshCompare(FmsMesh lhs,FmsMesh rhs)

{
  FmsInt FVar1;
  FmsDomain *ppFVar2;
  FmsDomain *ppFVar3;
  int iVar4;
  int iVar5;
  FmsInt i;
  FmsInt FVar6;
  FmsInt i_1;
  FmsInt j;
  FmsInt FVar7;
  int iVar8;
  char *lhs_dname;
  FmsDomain *rhs_domains;
  FmsDomain *lhs_domains;
  FmsInt rhs_ndomains;
  FmsInt lhs_ndomains;
  char *rhs_dname;
  FmsMesh local_40;
  FmsMesh local_38;
  
  if (lhs == rhs) {
    iVar8 = 0;
  }
  else if (lhs == (FmsMesh)0x0) {
    iVar8 = -1;
  }
  else if (rhs == (FmsMesh)0x0) {
    iVar8 = -2;
  }
  else {
    FVar1 = lhs->num_domain_names;
    if (FVar1 == rhs->num_domain_names) {
      iVar8 = 0;
      local_40 = lhs;
      local_38 = rhs;
      for (FVar6 = 0; FVar6 != FVar1; FVar6 = FVar6 + 1) {
        lhs_dname = (char *)0x0;
        rhs_dname = (char *)0x0;
        lhs_ndomains = 0;
        rhs_ndomains = 0xffffffffffffffff;
        lhs_domains = (FmsDomain *)0x0;
        rhs_domains = (FmsDomain *)0x0;
        FmsMeshGetDomains(lhs,FVar6,&lhs_dname,&lhs_ndomains,&lhs_domains);
        FmsMeshGetDomains(rhs,FVar6,&rhs_dname,&rhs_ndomains,&rhs_domains);
        iVar4 = strcmp(lhs_dname,rhs_dname);
        ppFVar3 = lhs_domains;
        ppFVar2 = rhs_domains;
        if ((iVar4 == 0) && (lhs_ndomains == rhs_ndomains)) {
          for (FVar7 = 0; rhs = local_38, lhs = local_40, FVar1 != FVar7; FVar7 = FVar7 + 1) {
            iVar5 = FmsDomainCompare(ppFVar3[FVar7],ppFVar2[FVar7]);
            iVar4 = iVar8 + 100;
            if (iVar5 == 0) {
              iVar4 = iVar8;
            }
            iVar8 = iVar4;
          }
        }
        else {
          iVar8 = iVar8 + 10;
        }
      }
    }
    else {
      iVar8 = 1;
    }
    FVar1 = lhs->num_comps;
    if (FVar1 == rhs->num_comps) {
      for (FVar6 = 0; FVar1 != FVar6; FVar6 = FVar6 + 1) {
        iVar5 = FmsComponentCompare(lhs->comps[FVar6],rhs->comps[FVar6]);
        iVar4 = iVar8 + 1000;
        if (iVar5 == 0) {
          iVar4 = iVar8;
        }
        iVar8 = iVar4;
      }
    }
    else {
      iVar8 = iVar8 + 1000;
    }
    FVar1 = lhs->num_tags;
    if (FVar1 == rhs->num_tags) {
      for (FVar6 = 0; FVar1 != FVar6; FVar6 = FVar6 + 1) {
        iVar5 = FmsTagCompare(lhs->tags[FVar6],rhs->tags[FVar6]);
        iVar4 = iVar8 + 10000;
        if (iVar5 == 0) {
          iVar4 = iVar8;
        }
        iVar8 = iVar4;
      }
    }
    else {
      iVar8 = iVar8 + 10000;
    }
  }
  return iVar8;
}

Assistant:

int FmsMeshCompare(FmsMesh lhs, FmsMesh rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;
  // Compare domain names size
  FmsInt lhs_ndnames = 0, rhs_ndnames = -1;
  FmsMeshGetNumDomainNames(lhs, &lhs_ndnames);
  FmsMeshGetNumDomainNames(rhs, &rhs_ndnames);

  // Compare domain names & domains
  if(lhs_ndnames != rhs_ndnames) {
    diff += 1;
  } else {
    for(FmsInt i = 0; i < lhs_ndnames; i++) {
      const char *lhs_dname = NULL, *rhs_dname = NULL;
      FmsInt lhs_ndomains = 0, rhs_ndomains = -1;
      FmsDomain *lhs_domains = NULL, *rhs_domains = NULL;
      FmsMeshGetDomains(lhs, i, &lhs_dname, &lhs_ndomains, &lhs_domains);
      FmsMeshGetDomains(rhs, i, &rhs_dname, &rhs_ndomains, &rhs_domains);
      if(strcmp(lhs_dname, rhs_dname)) {
        diff += 10;
        continue;
      }
      if(lhs_ndomains != rhs_ndomains) {
        diff += 10;
        continue;
      }
      for(FmsInt j = 0; j < lhs_ndnames; j++) {
        if(FmsDomainCompare(lhs_domains[j], rhs_domains[j])) {
          diff += 100;
        }
      }
    }
  }

  // Compare components
  FmsInt lhs_ncomponents = 0, rhs_ncomponents = -1;
  FmsMeshGetNumComponents(lhs, &lhs_ncomponents);
  FmsMeshGetNumComponents(rhs, &rhs_ncomponents);
  if(lhs_ncomponents != rhs_ncomponents) {
    diff += 1000;
  } else {
    for(FmsInt i = 0; i < lhs_ncomponents; i++) {
      FmsComponent lhs_component = NULL, rhs_component = NULL;
      FmsMeshGetComponent(lhs, i, &lhs_component);
      FmsMeshGetComponent(rhs, i, &rhs_component);
      if(FmsComponentCompare(lhs_component, rhs_component)) {
        diff += 1000;
      }
    }
  }

  // Compare tags
  FmsInt lhs_ntags = 0, rhs_ntags = -1;
  FmsMeshGetNumTags(lhs, &lhs_ntags);
  FmsMeshGetNumTags(rhs, &rhs_ntags);
  if(lhs_ntags != rhs_ntags) {
    diff += 10000;
  } else {
    for(FmsInt i = 0; i < lhs_ntags; i++) {
      FmsTag lhs_tag = NULL, rhs_tag = NULL;
      FmsMeshGetTag(lhs, i, &lhs_tag);
      FmsMeshGetTag(rhs, i, &rhs_tag);
      if(FmsTagCompare(lhs_tag, rhs_tag)) {
        diff += 10000;
      }
    }
  }

  // Q: Should we actually compare PartitionId?
  //  I feel like if two meshes identical meshes came from two different partitions
  //  then we should say they are equal.
  // FmsMeshGetPartitionId
  return diff;
}